

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_object_seal(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int freeze_flag)

{
  JSAtom prop;
  JSValue getter;
  JSValue setter;
  int iVar1;
  int iVar2;
  JSRefCountHeader *p;
  JSObject *p_00;
  ulong uVar3;
  JSValue JVar4;
  int64_t iStackY_e0;
  uint32_t len;
  JSPropertyEnum *props;
  undefined4 local_88;
  uint uStack_84;
  undefined8 uStack_80;
  undefined4 local_78;
  uint uStack_74;
  undefined8 uStack_70;
  JSPropertyDescriptor desc;
  
  p_00 = (JSObject *)(argv->u).ptr;
  iStackY_e0 = argv->tag;
  JVar4 = *argv;
  if ((uint)iStackY_e0 == 0xffffffff) {
    iVar1 = JS_PreventExtensions(ctx,*argv);
    if (-1 < iVar1) {
      if (iVar1 == 0) {
        JS_ThrowTypeError(ctx,"proxy preventExtensions handler returned false");
      }
      else {
        iVar1 = JS_GetOwnPropertyNamesInternal(ctx,&props,&len,p_00,3);
        if (iVar1 == 0) {
          for (uVar3 = 0; len != uVar3; uVar3 = uVar3 + 1) {
            prop = props[uVar3].atom;
            iVar1 = 0x4100;
            if (freeze_flag != 0) {
              iVar2 = JS_GetOwnPropertyInternal(ctx,&desc,p_00,prop);
              if (-1 < iVar2) {
                if (iVar2 != 0) {
                  iVar1 = (desc.flags & 2U | 0x41) << 8;
                  js_free_desc(ctx,&desc);
                }
                goto LAB_0012b81a;
              }
LAB_0012b86a:
              js_free_prop_enum(ctx,props,len);
              p_00 = (JSObject *)0x0;
              uVar3 = 0;
              iStackY_e0 = 6;
              goto LAB_0012b78e;
            }
LAB_0012b81a:
            local_78 = 0;
            uStack_70 = 3;
            local_88 = 0;
            uStack_80 = 3;
            getter.tag = 3;
            getter.u.ptr = (void *)((ulong)uStack_74 << 0x20);
            setter.tag = 3;
            setter.u.ptr = (void *)((ulong)uStack_84 << 0x20);
            iVar1 = JS_DefineProperty(ctx,JVar4,prop,(JSValue)(ZEXT816(3) << 0x40),getter,setter,
                                      iVar1);
            if (iVar1 < 0) goto LAB_0012b86a;
          }
          js_free_prop_enum(ctx,props,len);
          goto LAB_0012b765;
        }
      }
    }
    p_00 = (JSObject *)0x0;
    uVar3 = 0;
    iStackY_e0 = 6;
  }
  else {
    if (0xfffffff4 < (uint)iStackY_e0) {
LAB_0012b765:
      (p_00->field_0).header.ref_count = (p_00->field_0).header.ref_count + 1;
    }
    uVar3 = (ulong)p_00 & 0xffffffff00000000;
  }
LAB_0012b78e:
  JVar4.u.ptr = (void *)((ulong)p_00 & 0xffffffff | uVar3);
  JVar4.tag = iStackY_e0;
  return JVar4;
}

Assistant:

static JSValue js_object_seal(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv, int freeze_flag)
{
    JSValueConst obj = argv[0];
    JSObject *p;
    JSPropertyEnum *props;
    uint32_t len, i;
    int flags, desc_flags, res;

    if (!JS_IsObject(obj))
        return JS_DupValue(ctx, obj);

    res = JS_PreventExtensions(ctx, obj);
    if (res < 0)
        return JS_EXCEPTION;
    if (!res) {
        return JS_ThrowTypeError(ctx, "proxy preventExtensions handler returned false");
    }
    
    p = JS_VALUE_GET_OBJ(obj);
    flags = JS_GPN_STRING_MASK | JS_GPN_SYMBOL_MASK;
    if (JS_GetOwnPropertyNamesInternal(ctx, &props, &len, p, flags))
        return JS_EXCEPTION;

    for(i = 0; i < len; i++) {
        JSPropertyDescriptor desc;
        JSAtom prop = props[i].atom;

        desc_flags = JS_PROP_THROW | JS_PROP_HAS_CONFIGURABLE;
        if (freeze_flag) {
            res = JS_GetOwnPropertyInternal(ctx, &desc, p, prop);
            if (res < 0)
                goto exception;
            if (res) {
                if (desc.flags & JS_PROP_WRITABLE)
                    desc_flags |= JS_PROP_HAS_WRITABLE;
                js_free_desc(ctx, &desc);
            }
        }
        if (JS_DefineProperty(ctx, obj, prop, JS_UNDEFINED,
                              JS_UNDEFINED, JS_UNDEFINED, desc_flags) < 0)
            goto exception;
    }
    js_free_prop_enum(ctx, props, len);
    return JS_DupValue(ctx, obj);

 exception:
    js_free_prop_enum(ctx, props, len);
    return JS_EXCEPTION;
}